

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiter.h
# Opt level: O1

bool __thiscall
jaegertracing::utils::RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
checkCredit(RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *this,
           double itemCost)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar1 == 0) {
    lVar2 = _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0 - (this->_lastTick).__d.__r;
    (this->_lastTick).__d.__r = _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0;
    dVar3 = ((double)lVar2 / 1000000000.0) * this->_creditsPerSecond + this->_balance;
    this->_balance = dVar3;
    if (this->_maxBalance < dVar3) {
      this->_balance = this->_maxBalance;
    }
    dVar3 = this->_balance;
    if (1.0 <= dVar3) {
      this->_balance = dVar3 + -1.0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return 1.0 <= dVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool checkCredit(double itemCost)
    {
        std::lock_guard<std::mutex> lock(_mutex);
        const auto currentTime = Clock::now();
        const auto elapsedTime =
            std::chrono::duration<double>(currentTime - _lastTick);
        _lastTick = currentTime;

        _balance += elapsedTime.count() * _creditsPerSecond;
        if (_balance > _maxBalance) {
            _balance = _maxBalance;
        }

        if (_balance >= itemCost) {
            _balance -= itemCost;
            return true;
        }

        return false;
    }